

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceManager.cpp
# Opt level: O2

void __thiscall
OpenMD::ForceManager::selectedLongRangeInteractions
          (ForceManager *this,Molecule *mol1,Molecule *mol2)

{
  InteractionData *idat;
  SelfData *sdat;
  bool *pbVar1;
  double dVar2;
  CutoffMethod CVar3;
  uint uVar4;
  uint uVar5;
  Snapshot *pSVar6;
  ForceDecomposition *pFVar7;
  pointer pdVar8;
  ForceManager *pFVar9;
  Vector3d *v2;
  long lVar10;
  bool bVar11;
  bool bVar12;
  int iVar13;
  uint uVar14;
  undefined4 extraout_var;
  pointer piVar15;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar16;
  Vector<double,_3U> *v;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  SimInfo *pSVar17;
  uint *puVar18;
  long lVar19;
  uint atom1_1;
  ForceManager *pFVar20;
  uint atom1;
  uint uVar21;
  CutoffGroup *pCVar22;
  long lVar23;
  pointer ppCVar24;
  Vector3d *v1;
  uint *puVar25;
  vector<int,_std::allocator<int>_> atomListRow;
  vector<int,_std::allocator<int>_> atomListColumn;
  Vector3d fg;
  RealType surfacePotential;
  RealType reciprocalPotential;
  RealType rgrpsq;
  Vector3d d_grp;
  RealType dswdr;
  RealType rgrp;
  Vector3d vel2;
  Mat3x3d bbox;
  Vector3d dag;
  Vector3d fij;
  Vector3d gvel2;
  potVec selectionPotential;
  potVec selfPotential;
  potVec longRangePotential;
  uint local_4ac;
  _Vector_base<int,_std::allocator<int>_> local_478;
  vector<int,_std::allocator<int>_> *local_460;
  Mat3x3d *local_458;
  ForceManager *local_450;
  SelectionManager *local_448;
  double local_440;
  _Vector_base<int,_std::allocator<int>_> local_438;
  Vector<double,_3U> local_420;
  Vector3d *local_408;
  uint local_3fc;
  uint *local_3f8;
  ulong uStack_3f0;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *local_3e0;
  long local_3d8;
  Snapshot *local_3d0;
  RealType local_3c8;
  RealType local_3c0;
  double local_3b8;
  Vector<double,_3U> local_3b0;
  vector<int,_std::allocator<int>_> *local_398;
  RealType *local_390;
  Vector3d *local_388;
  Vector3d *local_380;
  RealType *local_378;
  RealType *local_370;
  potVec *local_368;
  potVec *local_360;
  potVec *local_358;
  double local_350;
  double local_348;
  Vector<double,_3U> local_340;
  RectMatrix<double,_3U,_3U> local_328;
  Vector<double,_3U> local_2e0;
  Vector<double,_7U> local_2c8;
  Vector<double,_3U> local_290;
  _Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> local_278;
  Vector<double,_3U> local_260;
  Vector<double,_3U> local_248;
  Vector<double,_3U> local_230;
  Vector<double,_3U> local_218;
  Vector<double,_3U> local_200;
  Vector<double,_3U> local_1e8;
  Vector<double,_3U> local_1d0;
  Vector<double,_7U> local_1b8;
  Vector<double,_7U> local_180;
  Vector<double,_7U> local_148;
  Vector<double,_7U> local_110;
  Vector<double,_7U> local_d8;
  Vector<double,_7U> local_a0;
  Vector<double,_7U> local_68;
  undefined4 extraout_var_02;
  
  pSVar17 = this->info_;
  pSVar6 = pSVar17->sman_->currentSnapshot_;
  local_450 = this;
  if (pSVar17->nCutoffGroups_ == pSVar17->nAtoms_) {
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator=
              (&(pSVar6->cgData).position,
               (vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)pSVar6)
    ;
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator=
              (&(pSVar6->cgData).velocity,&(pSVar6->atomData).velocity);
  }
  else {
    ppCVar24 = (mol1->cutoffGroups_).
               super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if (ppCVar24 !=
        (mol1->cutoffGroups_).
        super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_001df960;
    pCVar22 = (CutoffGroup *)0x0;
    while (pCVar22 != (CutoffGroup *)0x0) {
      CutoffGroup::updateCOM(pCVar22);
      ppCVar24 = ppCVar24 + 1;
      pCVar22 = (CutoffGroup *)0x0;
      if (ppCVar24 !=
          (mol1->cutoffGroups_).
          super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
LAB_001df960:
        pCVar22 = *ppCVar24;
      }
    }
    ppCVar24 = (mol2->cutoffGroups_).
               super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if (ppCVar24 !=
        (mol2->cutoffGroups_).
        super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_001df996;
    pCVar22 = (CutoffGroup *)0x0;
    while (pCVar22 != (CutoffGroup *)0x0) {
      CutoffGroup::updateCOM(pCVar22);
      ppCVar24 = ppCVar24 + 1;
      pCVar22 = (CutoffGroup *)0x0;
      if (ppCVar24 !=
          (mol2->cutoffGroups_).
          super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
LAB_001df996:
        pCVar22 = *ppCVar24;
      }
    }
  }
  pFVar20 = local_450;
  local_3d0 = pSVar6;
  (*local_450->fDecomp_->_vptr_ForceDecomposition[5])();
  (*pFVar20->fDecomp_->_vptr_ForceDecomposition[4])();
  Vector<double,_3U>::Vector(&local_3b0);
  Vector<double,_3U>::Vector(&local_2e0);
  Vector<double,_3U>::Vector(&local_260);
  Vector<double,_3U>::Vector(&local_340);
  Vector<double,_3U>::Vector(&local_290);
  Vector<double,_3U>::Vector(&local_420);
  local_438._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_438._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_438._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_478._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_478._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_478._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_328.data_[0][0] = 0.0;
  Vector<double,_7U>::Vector(&local_148,(double *)&local_328);
  local_328.data_[0][0] = 0.0;
  Vector<double,_7U>::Vector(&local_180,(double *)&local_328);
  local_328.data_[0][0] = 0.0;
  Vector<double,_7U>::Vector(&local_1b8,(double *)&local_328);
  local_3c0 = 0.0;
  local_3c8 = 0.0;
  idat = &pFVar20->idat;
  (pFVar20->idat).rcut = pFVar20->rCut_;
  CVar3 = pFVar20->cutoffMethod_;
  (pFVar20->idat).shiftedPot = CVar3 == SHIFTED_POTENTIAL;
  (pFVar20->idat).shiftedForce = CVar3 - SHIFTED_FORCE < 2;
  bVar11 = pFVar20->doParticlePot_;
  (pFVar20->idat).doParticlePot = bVar11;
  bVar12 = pFVar20->doSitePotential_;
  (pFVar20->idat).doElectricField = pFVar20->doElectricField_;
  (pFVar20->idat).doSitePotential = bVar12;
  sdat = &pFVar20->sdat;
  (pFVar20->sdat).doParticlePot = bVar11;
  local_3fc = pFVar20->info_->requiresPrepair_ ^ 1;
  local_3e0 = &pFVar20->savedPositions_;
  local_398 = &pFVar20->neighborList_;
  local_460 = &pFVar20->point_;
  local_380 = &(pFVar20->idat).eField1;
  local_388 = &(pFVar20->idat).eField2;
  local_390 = &(pFVar20->idat).sPot1;
  local_378 = &(pFVar20->idat).sw;
  local_448 = &pFVar20->seleMan_;
  local_358 = &(pFVar20->idat).pot;
  local_360 = &(pFVar20->idat).excludedPot;
  local_368 = &(pFVar20->idat).selePot;
  local_408 = &(pFVar20->idat).f1;
  local_440 = 0.0;
  local_370 = &(pFVar20->idat).dVdFQ1;
  v1 = &(pFVar20->idat).d;
  local_458 = &pFVar20->virialTensor;
  uVar14 = local_3fc;
  do {
    if (uVar14 == 2) {
      (*pFVar20->fDecomp_->_vptr_ForceDecomposition[8])();
      pSVar6 = local_3d0;
      if (pFVar20->cutoffMethod_ == EWALD_FULL) {
        InteractionManager::doReciprocalSpaceSum(pFVar20->interactionMan_,&local_3c0);
        Snapshot::setReciprocalPotential(pSVar6,local_3c0);
      }
      if (pFVar20->useSurfaceTerm_ == true) {
        InteractionManager::doSurfaceTerm
                  (pFVar20->interactionMan_,pFVar20->useSlabGeometry_,pFVar20->axis_,&local_3c8);
        Snapshot::setSurfacePotential(pSVar6,local_3c8);
      }
      pFVar9 = local_450;
      pSVar17 = pFVar20->info_;
      if (pSVar17->requiresSelfCorrection_ == true) {
        for (uVar14 = 0; uVar14 < (uint)pSVar17->nAtoms_; uVar14 = uVar14 + 1) {
          if (pFVar9->doPotentialSelection_ == true) {
            iVar13 = (*pFVar9->fDecomp_->_vptr_ForceDecomposition[0x21])
                               (pFVar9->fDecomp_,(ulong)uVar14);
            bVar11 = SelectionManager::isGlobalIDSelected(local_448,iVar13);
            (pFVar9->sdat).isSelected = bVar11;
          }
          (*pFVar9->fDecomp_->_vptr_ForceDecomposition[0x29])(pFVar9->fDecomp_,sdat,(ulong)uVar14);
          InteractionManager::doSelfCorrection(pFVar9->interactionMan_,sdat);
          (*pFVar9->fDecomp_->_vptr_ForceDecomposition[0x2a])(pFVar9->fDecomp_,sdat,(ulong)uVar14);
          pSVar17 = pFVar9->info_;
        }
      }
      pFVar20 = local_450;
      (*local_450->fDecomp_->_vptr_ForceDecomposition[9])();
      (*pFVar20->fDecomp_->_vptr_ForceDecomposition[0xb])(&local_328);
      Vector<double,_7U>::operator=(&local_148,(Vector<double,_7U> *)&local_328);
      Vector<double,_7U>::Vector(&local_68,&local_148);
      Snapshot::setLongRangePotentials(pSVar6,&local_68);
      (*pFVar20->fDecomp_->_vptr_ForceDecomposition[10])(&local_328);
      Vector<double,_7U>::operator=(&local_180,(Vector<double,_7U> *)&local_328);
      Vector<double,_7U>::Vector(&local_a0,&local_180);
      Snapshot::setSelfPotentials(pSVar6,&local_a0);
      (*pFVar20->fDecomp_->_vptr_ForceDecomposition[0xe])(&local_328);
      (*pFVar20->fDecomp_->_vptr_ForceDecomposition[0xc])(&local_2c8);
      OpenMD::operator+(&local_d8,(Vector<double,_7U> *)&local_328,&local_2c8);
      Snapshot::setExcludedPotentials(pSVar6,&local_d8);
      if (pFVar20->doPotentialSelection_ == true) {
        Snapshot::getSelectionPotentials((potVec *)&local_328,pSVar6);
        Vector<double,_7U>::operator=(&local_1b8,(Vector<double,_7U> *)&local_328);
        (*pFVar20->fDecomp_->_vptr_ForceDecomposition[0xf])(&local_328);
        Vector<double,_7U>::add(&local_1b8,(Vector<double,_7U> *)&local_328);
        (*pFVar20->fDecomp_->_vptr_ForceDecomposition[0xd])(&local_328);
        Vector<double,_7U>::add(&local_1b8,(Vector<double,_7U> *)&local_328);
        Vector<double,_7U>::Vector(&local_110,&local_1b8);
        Snapshot::setSelectionPotentials(pSVar6,&local_110);
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_478);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_438);
      return;
    }
    if (uVar14 == local_3fc) {
      pFVar7 = pFVar20->fDecomp_;
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
                ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                 &local_278,local_3e0);
      iVar13 = (*pFVar7->_vptr_ForceDecomposition[0x10])(pFVar7,&local_278);
      std::_Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
      ~_Vector_base(&local_278);
      if ((char)iVar13 != '\0') {
        if (pFVar20->usePeriodicBoundaryConditions_ == false) {
          Thermo::getBoundingBox((Mat3x3d *)&local_328,pFVar20->thermo);
        }
        (*pFVar20->fDecomp_->_vptr_ForceDecomposition[0x11])
                  (pFVar20->fDecomp_,local_398,local_460,local_3e0);
      }
    }
    piVar15 = (local_460->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start;
    lVar10 = 0;
    while (lVar19 = lVar10,
          lVar19 < ((long)(pFVar20->point_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)piVar15) * 0x40000000 +
                   -0x100000000 >> 0x20) {
      iVar13 = (*pFVar20->fDecomp_->_vptr_ForceDecomposition[0x13])(pFVar20->fDecomp_,lVar19);
      std::vector<int,_std::allocator<int>_>::operator=
                ((vector<int,_std::allocator<int>_> *)&local_478,
                 (vector<int,_std::allocator<int>_> *)CONCAT44(extraout_var,iVar13));
      piVar15 = (local_460->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      local_3d8 = lVar19 + 1;
      local_4ac = 1;
      for (lVar23 = (long)piVar15[lVar19]; lVar10 = local_3d8, lVar23 < piVar15[local_3d8];
          lVar23 = lVar23 + 1) {
        uVar21 = (pFVar20->neighborList_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar23];
        (*pFVar20->fDecomp_->_vptr_ForceDecomposition[0x19])(&local_328,pFVar20->fDecomp_,lVar19);
        Vector<double,_3U>::operator=(&local_3b0,(Vector<double,_3U> *)&local_328);
        local_3b8 = Vector<double,_3U>::lengthSquare(&local_3b0);
        if (local_3b8 < pFVar20->rCutSq_) {
          if (uVar14 == 1) {
            Vector<double,_3U>::zero(&local_290);
            Vector<double,_3U>::zero(&local_380->super_Vector<double,_3U>);
            Vector<double,_3U>::zero(&local_388->super_Vector<double,_3U>);
            *local_390 = 0.0;
            local_390[1] = 0.0;
            local_440 = 0.0;
          }
          bVar11 = SwitchingFunction::getSwitch
                             (pFVar20->switcher_,&local_3b8,local_378,&local_350,&local_348);
          iVar13 = (*pFVar20->fDecomp_->_vptr_ForceDecomposition[0x14])
                             (pFVar20->fDecomp_,(ulong)uVar21);
          std::vector<int,_std::allocator<int>_>::operator=
                    ((vector<int,_std::allocator<int>_> *)&local_438,
                     (vector<int,_std::allocator<int>_> *)CONCAT44(extraout_var_00,iVar13));
          puVar18 = (uint *)local_478._M_impl.super__Vector_impl_data._M_start;
          if (pFVar20->doHeatFlux_ == true) {
            iVar13 = (*pFVar20->fDecomp_->_vptr_ForceDecomposition[0x12])
                               (pFVar20->fDecomp_,(ulong)uVar21);
            Vector<double,_3U>::operator=
                      (&local_260,(Vector<double,_3U> *)CONCAT44(extraout_var_01,iVar13));
            puVar18 = (uint *)local_478._M_impl.super__Vector_impl_data._M_start;
          }
          while (puVar18 != (uint *)local_478._M_impl.super__Vector_impl_data._M_finish) {
            uVar16 = (long)local_478._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_478._M_impl.super__Vector_impl_data._M_start;
            uVar4 = *puVar18;
            if (pFVar20->doPotentialSelection_ == true) {
              iVar13 = (*pFVar20->fDecomp_->_vptr_ForceDecomposition[0x1f])
                                 (pFVar20->fDecomp_,(ulong)uVar4);
              bVar12 = SelectionManager::isGlobalIDSelected(local_448,iVar13);
              (pFVar20->idat).isSelected = bVar12;
            }
            local_4ac = (uint)(4 < uVar16 | (byte)local_4ac);
            local_3f8 = puVar18;
            for (puVar25 = (uint *)local_438._M_impl.super__Vector_impl_data._M_start;
                puVar25 != (uint *)local_438._M_impl.super__Vector_impl_data._M_finish;
                puVar25 = puVar25 + 1) {
              uVar5 = *puVar25;
              uVar16 = (ulong)uVar5;
              if (pFVar20->doPotentialSelection_ == true) {
                iVar13 = (*pFVar20->fDecomp_->_vptr_ForceDecomposition[0x20])
                                   (pFVar20->fDecomp_,uVar16);
                bVar12 = SelectionManager::isGlobalIDSelected(local_448,iVar13);
                pbVar1 = &(pFVar20->idat).isSelected;
                *pbVar1 = (bool)(*pbVar1 | bVar12);
              }
              iVar13 = (*pFVar20->fDecomp_->_vptr_ForceDecomposition[0x1d])
                                 (pFVar20->fDecomp_,(ulong)uVar4,uVar16,lVar19,(ulong)uVar21);
              if ((char)iVar13 == '\0') {
                (pFVar20->idat).vpair = 0.0;
                local_2c8.data_[0] = 0.0;
                Vector<double,_7U>::Vector((Vector<double,_7U> *)&local_328,local_2c8.data_);
                Vector<double,_7U>::operator=(local_358,(Vector<double,_7U> *)&local_328);
                local_2c8.data_[0] = 0.0;
                Vector<double,_7U>::Vector((Vector<double,_7U> *)&local_328,local_2c8.data_);
                Vector<double,_7U>::operator=(local_360,(Vector<double,_7U> *)&local_328);
                local_2c8.data_[0] = 0.0;
                Vector<double,_7U>::Vector((Vector<double,_7U> *)&local_328,local_2c8.data_);
                Vector<double,_7U>::operator=(local_368,(Vector<double,_7U> *)&local_328);
                Vector<double,_3U>::zero(&local_408->super_Vector<double,_3U>);
                pFVar20 = local_450;
                *local_370 = 0.0;
                local_370[1] = 0.0;
                (*local_450->fDecomp_->_vptr_ForceDecomposition[0x26])
                          (local_450->fDecomp_,idat,(ulong)uVar4,uVar16,(ulong)local_4ac);
                iVar13 = (*pFVar20->fDecomp_->_vptr_ForceDecomposition[0x22])
                                   (pFVar20->fDecomp_,(ulong)uVar4,(ulong)uVar5);
                (pFVar20->idat).topoDist = iVar13;
                pdVar8 = (pFVar20->electrostaticScale_).
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
                (pFVar20->idat).vdwMult =
                     (pFVar20->vdwScale_).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start[iVar13];
                (pFVar20->idat).electroMult = pdVar8[iVar13];
                if (((long)local_478._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_478._M_impl.super__Vector_impl_data._M_start == 4) &&
                   ((long)local_438._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_438._M_impl.super__Vector_impl_data._M_start == 4)) {
                  Vector<double,_3U>::operator=(&v1->super_Vector<double,_3U>,&local_3b0);
                  (pFVar20->idat).r2 = local_3b8;
                  v = &local_260;
                  if (pFVar20->doHeatFlux_ == true) {
LAB_001def9b:
                    Vector<double,_3U>::operator=(&local_340,v);
                  }
                }
                else {
                  (*pFVar20->fDecomp_->_vptr_ForceDecomposition[0x1a])
                            (&local_328,pFVar20->fDecomp_,(ulong)uVar4,(ulong)uVar5);
                  Vector<double,_3U>::operator=
                            (&v1->super_Vector<double,_3U>,(Vector<double,_3U> *)&local_328);
                  Snapshot::wrapVector(local_3d0,v1);
                  dVar2 = Vector<double,_3U>::lengthSquare(&v1->super_Vector<double,_3U>);
                  (pFVar20->idat).r2 = dVar2;
                  if (pFVar20->doHeatFlux_ == true) {
                    iVar13 = (*pFVar20->fDecomp_->_vptr_ForceDecomposition[0x25])
                                       (pFVar20->fDecomp_,(ulong)uVar5);
                    v = (Vector<double,_3U> *)CONCAT44(extraout_var_02,iVar13);
                    goto LAB_001def9b;
                  }
                }
                dVar2 = (pFVar20->idat).r2;
                if (dVar2 < 0.0) {
                  dVar2 = sqrt(dVar2);
                }
                else {
                  dVar2 = SQRT(dVar2);
                }
                (pFVar20->idat).rij = dVar2;
                if (uVar14 == 0) {
                  InteractionManager::doPrePair(pFVar20->interactionMan_,idat);
                  (*pFVar20->fDecomp_->_vptr_ForceDecomposition[0x27])
                            (pFVar20->fDecomp_,idat,(ulong)uVar4,uVar16);
                }
                else {
                  InteractionManager::doPair(pFVar20->interactionMan_,idat);
                  (*pFVar20->fDecomp_->_vptr_ForceDecomposition[0x28])
                            (pFVar20->fDecomp_,idat,(ulong)uVar4,uVar16);
                  v2 = local_408;
                  local_440 = local_440 + (pFVar20->idat).vpair;
                  Vector<double,_3U>::add(&local_290,&local_408->super_Vector<double,_3U>);
                  outProduct<double>((SquareMatrix3<double> *)&local_328,v1,v2);
                  RectMatrix<double,_3U,_3U>::sub
                            ((RectMatrix<double,_3U,_3U> *)local_458,&local_328);
                  if (pFVar20->doHeatFlux_ == true) {
                    pFVar7 = pFVar20->fDecomp_;
                    dVar2 = dot<double,3u>(&local_408->super_Vector<double,_3U>,&local_340);
                    operator*((Vector<double,_3U> *)&local_328,&v1->super_Vector<double,_3U>,dVar2);
                    Vector<double,_3U>::Vector(&local_1d0,(Vector<double,_3U> *)&local_328);
                    (*pFVar7->_vptr_ForceDecomposition[0x2d])(pFVar7,&local_1d0);
                  }
                }
                local_4ac = 0;
              }
            }
            puVar18 = local_3f8 + 1;
          }
          if (bVar11 && uVar14 == 1) {
            local_3f8 = (uint *)((local_350 * local_440) / local_348);
            uStack_3f0 = 0;
            operator*((Vector<double,_3U> *)&local_328,(double)local_3f8,&local_3b0);
            Vector3<double>::operator=
                      ((Vector3<double> *)&local_420,(Vector<double,_3U> *)&local_328);
            Vector<double,_3U>::add(&local_290,&local_420);
            puVar18 = (uint *)local_478._M_impl.super__Vector_impl_data._M_start;
            if ((((long)local_478._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_478._M_impl.super__Vector_impl_data._M_start == 4) &&
                ((long)local_438._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_438._M_impl.super__Vector_impl_data._M_start == 4)) &&
               (iVar13 = (*pFVar20->fDecomp_->_vptr_ForceDecomposition[0x1d])
                                   (pFVar20->fDecomp_,
                                    (ulong)(uint)*local_478._M_impl.super__Vector_impl_data._M_start
                                    ,(ulong)(uint)*local_438._M_impl.super__Vector_impl_data.
                                                   _M_start,lVar19,(ulong)uVar21),
               puVar18 = (uint *)local_478._M_impl.super__Vector_impl_data._M_start,
               (char)iVar13 == '\0')) {
              outProduct<double>((SquareMatrix3<double> *)&local_328,v1,
                                 (Vector3<double> *)&local_420);
              RectMatrix<double,_3U,_3U>::sub((RectMatrix<double,_3U,_3U> *)local_458,&local_328);
              puVar18 = (uint *)local_478._M_impl.super__Vector_impl_data._M_start;
              if (pFVar20->doHeatFlux_ == true) {
                pFVar7 = pFVar20->fDecomp_;
                dVar2 = dot<double,3u>(&local_420,&local_340);
                operator*((Vector<double,_3U> *)&local_328,&v1->super_Vector<double,_3U>,dVar2);
                Vector<double,_3U>::Vector(&local_1e8,(Vector<double,_3U> *)&local_328);
                (*pFVar7->_vptr_ForceDecomposition[0x2d])(pFVar7,&local_1e8);
                puVar18 = (uint *)local_478._M_impl.super__Vector_impl_data._M_start;
              }
            }
            for (; puVar18 != (uint *)local_478._M_impl.super__Vector_impl_data._M_finish;
                puVar18 = puVar18 + 1) {
              uVar4 = *puVar18;
              iVar13 = (*pFVar20->fDecomp_->_vptr_ForceDecomposition[0x17])
                                 (pFVar20->fDecomp_,(ulong)uVar4);
              dVar2 = *(double *)CONCAT44(extraout_var_03,iVar13);
              operator*((Vector<double,_3U> *)&local_2c8,(double)local_3f8,&local_3b0);
              operator*((Vector<double,_3U> *)&local_328,(Vector<double,_3U> *)&local_2c8,dVar2);
              Vector3<double>::operator=
                        ((Vector3<double> *)&local_420,(Vector<double,_3U> *)&local_328);
              pFVar7 = pFVar20->fDecomp_;
              Vector<double,_3U>::Vector(&local_200,&local_420);
              (*pFVar7->_vptr_ForceDecomposition[0x23])(pFVar7,(ulong)uVar4,&local_200);
              if ((4 < (ulong)((long)local_478._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_478._M_impl.super__Vector_impl_data._M_start)) &&
                 (pFVar20->info_->usesAtomicVirial_ == true)) {
                (*pFVar20->fDecomp_->_vptr_ForceDecomposition[0x15])
                          (&local_328,pFVar20->fDecomp_,(ulong)uVar4,lVar19);
                Vector<double,_3U>::operator=(&local_2e0,(Vector<double,_3U> *)&local_328);
                outProduct<double>((SquareMatrix3<double> *)&local_328,(Vector3<double> *)&local_2e0
                                   ,(Vector3<double> *)&local_420);
                RectMatrix<double,_3U,_3U>::sub((RectMatrix<double,_3U,_3U> *)local_458,&local_328);
                if (pFVar20->doHeatFlux_ == true) {
                  pFVar7 = pFVar20->fDecomp_;
                  dVar2 = dot<double,3u>(&local_420,&local_340);
                  operator*((Vector<double,_3U> *)&local_328,&local_2e0,dVar2);
                  Vector<double,_3U>::Vector(&local_218,(Vector<double,_3U> *)&local_328);
                  (*pFVar7->_vptr_ForceDecomposition[0x2d])(pFVar7,&local_218);
                }
              }
            }
            local_3f8 = (uint *)((ulong)local_3f8 ^ 0x8000000000000000);
            uStack_3f0 = uStack_3f0 ^ 0x8000000000000000;
            for (puVar18 = (uint *)local_438._M_impl.super__Vector_impl_data._M_start;
                puVar18 != (uint *)local_438._M_impl.super__Vector_impl_data._M_finish;
                puVar18 = puVar18 + 1) {
              uVar4 = *puVar18;
              iVar13 = (*pFVar20->fDecomp_->_vptr_ForceDecomposition[0x18])
                                 (pFVar20->fDecomp_,(ulong)uVar4);
              dVar2 = *(double *)CONCAT44(extraout_var_04,iVar13);
              operator*((Vector<double,_3U> *)&local_2c8,(double)local_3f8,&local_3b0);
              operator*((Vector<double,_3U> *)&local_328,(Vector<double,_3U> *)&local_2c8,dVar2);
              Vector3<double>::operator=
                        ((Vector3<double> *)&local_420,(Vector<double,_3U> *)&local_328);
              pFVar7 = pFVar20->fDecomp_;
              Vector<double,_3U>::Vector(&local_230,&local_420);
              (*pFVar7->_vptr_ForceDecomposition[0x24])(pFVar7,(ulong)uVar4,&local_230);
              if ((4 < (ulong)((long)local_438._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_438._M_impl.super__Vector_impl_data._M_start)) &&
                 (pFVar20->info_->usesAtomicVirial_ == true)) {
                (*pFVar20->fDecomp_->_vptr_ForceDecomposition[0x16])
                          (&local_328,pFVar20->fDecomp_,(ulong)uVar4,(ulong)uVar21);
                Vector<double,_3U>::operator=(&local_2e0,(Vector<double,_3U> *)&local_328);
                outProduct<double>((SquareMatrix3<double> *)&local_328,(Vector3<double> *)&local_2e0
                                   ,(Vector3<double> *)&local_420);
                RectMatrix<double,_3U,_3U>::sub((RectMatrix<double,_3U,_3U> *)local_458,&local_328);
                if (pFVar20->doHeatFlux_ == true) {
                  pFVar7 = pFVar20->fDecomp_;
                  dVar2 = dot<double,3u>(&local_420,&local_340);
                  operator*((Vector<double,_3U> *)&local_328,&local_2e0,dVar2);
                  Vector<double,_3U>::Vector(&local_248,(Vector<double,_3U> *)&local_328);
                  (*pFVar7->_vptr_ForceDecomposition[0x2d])(pFVar7,&local_248);
                }
              }
            }
          }
        }
        piVar15 = (local_460->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start;
      }
    }
    if ((uVar14 == 0) && (pFVar20->info_->requiresPrepair_ == true)) {
      (*pFVar20->fDecomp_->_vptr_ForceDecomposition[6])();
      for (uVar21 = 0; uVar21 < (uint)pFVar20->info_->nAtoms_; uVar21 = uVar21 + 1) {
        if (pFVar20->doPotentialSelection_ == true) {
          iVar13 = (*pFVar20->fDecomp_->_vptr_ForceDecomposition[0x21])
                             (pFVar20->fDecomp_,(ulong)uVar21);
          bVar11 = SelectionManager::isGlobalIDSelected(local_448,iVar13);
          (pFVar20->sdat).isSelected = bVar11;
        }
        (*pFVar20->fDecomp_->_vptr_ForceDecomposition[0x2b])(pFVar20->fDecomp_,sdat,(ulong)uVar21);
        InteractionManager::doPreForce(pFVar20->interactionMan_,sdat);
        (*pFVar20->fDecomp_->_vptr_ForceDecomposition[0x2c])(pFVar20->fDecomp_,sdat,(ulong)uVar21);
      }
      (*pFVar20->fDecomp_->_vptr_ForceDecomposition[7])();
    }
    uVar14 = uVar14 + 1;
  } while( true );
}

Assistant:

void ForceManager::selectedLongRangeInteractions(Molecule* mol1,
                                                   Molecule* mol2) {
    Snapshot* curSnapshot = info_->getSnapshotManager()->getCurrentSnapshot();
    DataStorage* config   = &(curSnapshot->atomData);
    DataStorage* cgConfig = &(curSnapshot->cgData);

    // calculate the center of mass of cutoff group

    SimInfo::MoleculeIterator mi;
    Molecule::CutoffGroupIterator ci;
    CutoffGroup* cg;

    if (info_->getNCutoffGroups() != info_->getNAtoms()) {
      for (cg = mol1->beginCutoffGroup(ci); cg != NULL;
           cg = mol1->nextCutoffGroup(ci)) {
        cg->updateCOM();
      }
      for (cg = mol2->beginCutoffGroup(ci); cg != NULL;
           cg = mol2->nextCutoffGroup(ci)) {
        cg->updateCOM();
      }
    } else {
      // center of mass of the group is the same as position of the atom
      // if cutoff group does not exist
      cgConfig->position = config->position;
      cgConfig->velocity = config->velocity;
    }

    fDecomp_->zeroWorkArrays();
    fDecomp_->distributeData();

    int cg1, cg2, atom1, atom2;
    Vector3d d_grp, dag, gvel2, vel2;
    RealType rgrpsq, rgrp;
    RealType vij(0.0);
    Vector3d fij, fg;
    bool in_switching_region;
    RealType dswdr, swderiv;
    vector<int> atomListColumn, atomListRow;

    potVec longRangePotential(0.0);
    potVec selfPotential(0.0);
    potVec selectionPotential(0.0);
    RealType reciprocalPotential(0.0);
    RealType surfacePotential(0.0);

    RealType mf;
    bool newAtom1;
    int gid1, gid2;

    vector<int>::iterator ia, jb;

    int loopStart, loopEnd;

    idat.rcut       = rCut_;
    idat.shiftedPot = (cutoffMethod_ == SHIFTED_POTENTIAL) ? true : false;
    idat.shiftedForce =
        (cutoffMethod_ == SHIFTED_FORCE || cutoffMethod_ == TAYLOR_SHIFTED) ?
            true :
            false;
    idat.doParticlePot   = doParticlePot_;
    idat.doElectricField = doElectricField_;
    idat.doSitePotential = doSitePotential_;
    sdat.doParticlePot   = doParticlePot_;

    loopEnd = PAIR_LOOP;
    if (info_->requiresPrepair()) {
      loopStart = PREPAIR_LOOP;
    } else {
      loopStart = PAIR_LOOP;
    }
    for (int iLoop = loopStart; iLoop <= loopEnd; iLoop++) {
      if (iLoop == loopStart) {
        bool update_nlist = fDecomp_->checkNeighborList(savedPositions_);

        if (update_nlist) {
          if (!usePeriodicBoundaryConditions_)
            Mat3x3d bbox = thermo->getBoundingBox();
          fDecomp_->buildNeighborList(neighborList_, point_, savedPositions_);
        }
      }

      for (cg1 = 0; cg1 < int(point_.size()) - 1; cg1++) {
        atomListRow = fDecomp_->getAtomsInGroupRow(cg1);
        newAtom1    = true;

        for (int m2 = point_[cg1]; m2 < point_[cg1 + 1]; m2++) {
          cg2 = neighborList_[m2];

          d_grp = fDecomp_->getIntergroupVector(cg1, cg2);

          // already wrapped in the getIntergroupVector call:
          // curSnapshot->wrapVector(d_grp);
          rgrpsq = d_grp.lengthSquare();

          if (rgrpsq < rCutSq_) {
            if (iLoop == PAIR_LOOP) {
              vij = 0.0;
              fij.zero();
              idat.eField1.zero();
              idat.eField2.zero();
              idat.sPot1 = 0.0;
              idat.sPot2 = 0.0;
            }

            in_switching_region =
                switcher_->getSwitch(rgrpsq, idat.sw, dswdr, rgrp);

            atomListColumn = fDecomp_->getAtomsInGroupColumn(cg2);

            if (doHeatFlux_) gvel2 = fDecomp_->getGroupVelocityColumn(cg2);

            for (ia = atomListRow.begin(); ia != atomListRow.end(); ++ia) {
              if (atomListRow.size() > 1) newAtom1 = true;
              atom1 = (*ia);

              if (doPotentialSelection_) {
                gid1            = fDecomp_->getGlobalIDRow(atom1);
                idat.isSelected = seleMan_.isGlobalIDSelected(gid1);
              }

              for (jb = atomListColumn.begin(); jb != atomListColumn.end();
                   ++jb) {
                atom2 = (*jb);

                if (doPotentialSelection_) {
                  gid2 = fDecomp_->getGlobalIDCol(atom2);
                  idat.isSelected |= seleMan_.isGlobalIDSelected(gid2);
                }

                if (!fDecomp_->skipAtomPair(atom1, atom2, cg1, cg2)) {
                  idat.vpair       = 0.0;
                  idat.pot         = 0.0;
                  idat.excludedPot = 0.0;
                  idat.selePot     = 0.0;
                  idat.f1.zero();
                  idat.dVdFQ1 = 0.0;
                  idat.dVdFQ2 = 0.0;

                  fDecomp_->fillInteractionData(idat, atom1, atom2, newAtom1);
                  newAtom1 = false;

                  idat.topoDist =
                      fDecomp_->getTopologicalDistance(atom1, atom2);
                  idat.vdwMult     = vdwScale_[idat.topoDist];
                  idat.electroMult = electrostaticScale_[idat.topoDist];

                  if (atomListRow.size() == 1 && atomListColumn.size() == 1) {
                    idat.d  = d_grp;
                    idat.r2 = rgrpsq;
                    if (doHeatFlux_) vel2 = gvel2;
                  } else {
                    idat.d = fDecomp_->getInteratomicVector(atom1, atom2);
                    curSnapshot->wrapVector(idat.d);
                    idat.r2 = idat.d.lengthSquare();
                    if (doHeatFlux_)
                      vel2 = fDecomp_->getAtomVelocityColumn(atom2);
                  }

                  idat.rij = sqrt(idat.r2);

                  if (iLoop == PREPAIR_LOOP) {
                    interactionMan_->doPrePair(idat);
                    fDecomp_->unpackPrePairData(idat, atom1, atom2);
                  } else {
                    interactionMan_->doPair(idat);
                    fDecomp_->unpackInteractionData(idat, atom1, atom2);
                    vij += idat.vpair;
                    fij += idat.f1;
                    virialTensor -= outProduct(idat.d, idat.f1);
                    if (doHeatFlux_)
                      fDecomp_->addToHeatFlux(idat.d * dot(idat.f1, vel2));
                  }
                }
              }
            }

            if (iLoop == PAIR_LOOP) {
              if (in_switching_region) {
                swderiv = vij * dswdr / rgrp;
                fg      = swderiv * d_grp;
                fij += fg;

                if (atomListRow.size() == 1 && atomListColumn.size() == 1) {
                  if (!fDecomp_->skipAtomPair(atomListRow[0], atomListColumn[0],
                                              cg1, cg2)) {
                    virialTensor -= outProduct(idat.d, fg);
                    if (doHeatFlux_)
                      fDecomp_->addToHeatFlux(idat.d * dot(fg, vel2));
                  }
                }

                for (ia = atomListRow.begin(); ia != atomListRow.end(); ++ia) {
                  atom1 = (*ia);
                  mf    = fDecomp_->getMassFactorRow(atom1);
                  // fg is the force on atom ia due to cutoff group's
                  // presence in switching region
                  fg = swderiv * d_grp * mf;
                  fDecomp_->addForceToAtomRow(atom1, fg);
                  if (atomListRow.size() > 1) {
                    if (info_->usesAtomicVirial()) {
                      // find the distance between the atom
                      // and the center of the cutoff group:
                      dag = fDecomp_->getAtomToGroupVectorRow(atom1, cg1);
                      virialTensor -= outProduct(dag, fg);
                      if (doHeatFlux_)
                        fDecomp_->addToHeatFlux(dag * dot(fg, vel2));
                    }
                  }
                }
                for (jb = atomListColumn.begin(); jb != atomListColumn.end();
                     ++jb) {
                  atom2 = (*jb);
                  mf    = fDecomp_->getMassFactorColumn(atom2);
                  // fg is the force on atom jb due to cutoff group's
                  // presence in switching region
                  fg = -swderiv * d_grp * mf;
                  fDecomp_->addForceToAtomColumn(atom2, fg);

                  if (atomListColumn.size() > 1) {
                    if (info_->usesAtomicVirial()) {
                      // find the distance between the atom
                      // and the center of the cutoff group:
                      dag = fDecomp_->getAtomToGroupVectorColumn(atom2, cg2);
                      virialTensor -= outProduct(dag, fg);
                      if (doHeatFlux_)
                        fDecomp_->addToHeatFlux(dag * dot(fg, vel2));
                    }
                  }
                }
              }
              // if (!info_->usesAtomicVirial()) {
              //  virialTensor -= outProduct(d_grp, fij);
              //  if (doHeatFlux_)
              //     fDecomp_->addToHeatFlux( d_grp * dot(fij, vel2));
              //}
            }
          }
        }
      }

      if (iLoop == PREPAIR_LOOP) {
        if (info_->requiresPrepair()) {
          fDecomp_->collectIntermediateData();

          for (unsigned int atom1 = 0; atom1 < info_->getNAtoms(); atom1++) {
            if (doPotentialSelection_) {
              gid1            = fDecomp_->getGlobalID(atom1);
              sdat.isSelected = seleMan_.isGlobalIDSelected(gid1);
            }

            fDecomp_->fillPreForceData(sdat, atom1);
            interactionMan_->doPreForce(sdat);
            fDecomp_->unpackPreForceData(sdat, atom1);
          }

          fDecomp_->distributeIntermediateData();
        }
      }
    }

    // collects pairwise information
    fDecomp_->collectData();
    if (cutoffMethod_ == EWALD_FULL) {
      interactionMan_->doReciprocalSpaceSum(reciprocalPotential);
      curSnapshot->setReciprocalPotential(reciprocalPotential);
    }

    if (useSurfaceTerm_) {
      interactionMan_->doSurfaceTerm(useSlabGeometry_, axis_, surfacePotential);
      curSnapshot->setSurfacePotential(surfacePotential);
    }

    if (info_->requiresSelfCorrection()) {
      for (unsigned int atom1 = 0; atom1 < info_->getNAtoms(); atom1++) {
        if (doPotentialSelection_) {
          gid1            = fDecomp_->getGlobalID(atom1);
          sdat.isSelected = seleMan_.isGlobalIDSelected(gid1);
        }

        fDecomp_->fillSelfData(sdat, atom1);
        interactionMan_->doSelfCorrection(sdat);
        fDecomp_->unpackSelfData(sdat, atom1);
      }
    }

    // collects single-atom information
    fDecomp_->collectSelfData();

    longRangePotential = fDecomp_->getPairwisePotential();
    curSnapshot->setLongRangePotentials(longRangePotential);

    selfPotential = fDecomp_->getSelfPotential();
    curSnapshot->setSelfPotentials(selfPotential);

    curSnapshot->setExcludedPotentials(fDecomp_->getExcludedSelfPotential() +
                                       fDecomp_->getExcludedPotential());

    if (doPotentialSelection_) {
      selectionPotential = curSnapshot->getSelectionPotentials();
      selectionPotential += fDecomp_->getSelectedSelfPotential();
      selectionPotential += fDecomp_->getSelectedPotential();
      curSnapshot->setSelectionPotentials(selectionPotential);
    }
  }